

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid,REF_INT node)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *__ptr;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  undefined1 *puVar9;
  undefined8 uVar10;
  REF_INT node_00;
  long lVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  ulong uVar14;
  REF_DBL *pRVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  int iVar25;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  REF_CELL pRVar28;
  int iVar30;
  undefined1 auVar29 [16];
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  REF_INT degree;
  REF_DBL quality;
  REF_BOOL allowed;
  REF_DBL d_quality [3];
  REF_DBL NtinvNNtN [16];
  REF_DBL NtinvNNt [16];
  REF_DBL NNt [16];
  REF_DBL N [16];
  REF_INT nodes [27];
  REF_DBL invNNt [16];
  uint local_4b4;
  ulong local_4b0;
  REF_CELL local_4a8;
  double *local_4a0;
  REF_GRID local_498;
  REF_NODE local_490;
  REF_DBL local_488;
  double local_480;
  double local_478;
  uint local_46c;
  double *local_468;
  long local_460;
  long local_458;
  long local_450;
  double local_448;
  double dStack_440;
  double local_438;
  ulong local_428;
  REF_DBL local_420;
  REF_DBL local_418;
  REF_DBL local_410;
  REF_INT local_404;
  long local_400;
  ulong local_3f8;
  REF_INTERP local_3f0;
  REF_CELL local_3e8;
  long local_3e0;
  double local_3d8;
  int local_3cc;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double local_3a8 [16];
  double local_328 [16];
  double local_2a8 [4];
  undefined1 local_288 [96];
  REF_DBL local_228 [16];
  double local_1a8 [16];
  REF_INT local_128 [28];
  REF_DBL local_b8 [17];
  
  uVar8 = (ulong)(uint)node;
  local_490 = ref_grid->node;
  local_4a8 = ref_grid->cell[8];
  ref_smooth_local_cell_about(local_4a8,local_490,node,&local_3cc);
  if ((local_3cc == 0) ||
     ((-1 < node &&
      (((pRVar1 = ref_grid->cell[3]->ref_adj, node < pRVar1->nnode &&
        (pRVar1->first[(uint)node] != -1)) ||
       ((pRVar1 = ref_grid->cell[6]->ref_adj, node < pRVar1->nnode && (pRVar1->first[uVar8] != -1)))
       ))))) {
    return 0;
  }
  local_450 = (long)(node * 0xf);
  local_458 = (long)(node * 0xf + 1);
  local_460 = (long)(node * 0xf + 2);
  local_400 = (long)node;
  uVar5 = 0;
  local_4b0 = uVar8;
  local_498 = ref_grid;
  local_3f8 = uVar8;
  while( true ) {
    local_488 = 0.0;
    local_3f0 = local_498->interp;
    local_404 = -1;
    if ((local_3f0 != (REF_INTERP)0x0) && (local_3f0->continuously != 0)) {
      local_404 = local_3f0->cell[local_400];
    }
    pRVar15 = local_490->real;
    local_420 = pRVar15[local_450];
    local_418 = pRVar15[local_458];
    local_410 = pRVar15[local_460];
    uVar3 = ref_adj_degree(local_4a8->ref_adj,(REF_INT)local_4b0,(REF_INT *)&local_4b4);
    uVar4 = local_4b4;
    if (uVar3 != 0) {
      uVar8 = (ulong)uVar3;
      pcVar19 = "deg";
      uVar10 = 0x802;
      goto LAB_001cf8ff;
    }
    lVar11 = (long)(int)local_4b4;
    if (lVar11 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x804,"ref_smooth_tet_nso_step","malloc cells of REF_INT negative");
      uVar8 = 1;
      goto LAB_001cf909;
    }
    __ptr = (uint *)malloc(lVar11 * 4);
    if (__ptr == (uint *)0x0) break;
    pdVar6 = (double *)malloc(lVar11 * 8);
    if (pdVar6 == (double *)0x0) {
      pcVar19 = "malloc quals of REF_DBL NULL";
      uVar10 = 0x806;
      goto LAB_001cf8cc;
    }
    pdVar7 = (double *)malloc((ulong)(uVar4 * 3) << 3);
    if (pdVar7 == (double *)0x0) {
      pcVar19 = "malloc grads of REF_DBL NULL";
      uVar10 = 0x807;
      goto LAB_001cf8cc;
    }
    local_4b4 = 0;
    local_4a0 = pdVar6;
    local_46c = uVar5;
    local_468 = pdVar7;
    if ((((int)local_4b0 < 0) || (pRVar1 = local_4a8->ref_adj, pRVar1->nnode <= (int)local_4b0)) ||
       (lVar11 = (long)pRVar1->first[local_3f8], lVar11 == -1)) {
      *__ptr = 0xffffffff;
      uVar5 = 0xffffffff;
      local_478 = 1.0;
LAB_001cec74:
      local_448 = local_468[(int)(uVar5 * 3)];
      dStack_440 = (local_468 + (int)(uVar5 * 3))[1];
      local_438 = local_468[(long)(int)(uVar5 * 3) + 2];
      local_428 = 1;
LAB_001ceca0:
      uVar4 = ref_math_normalize(&local_448);
      if (uVar4 != 0) {
        uVar8 = (ulong)uVar4;
        pcVar19 = "norm";
        uVar10 = 0x861;
LAB_001cf8ff:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               uVar10,"ref_smooth_tet_nso_step",uVar8,pcVar19);
        goto LAB_001cf909;
      }
      lVar11 = (long)(int)(uVar5 * 3);
      dVar23 = local_468[lVar11 + 2] * local_438 +
               local_468[lVar11] * local_448 + local_468[lVar11 + 1] * dStack_440;
      if (dVar23 <= 0.0) {
        printf("%s: %d: %s: m0 not positive %e",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x868,"ref_smooth_tet_nso_step");
        goto LAB_001cf14b;
      }
      uVar8 = (ulong)(int)local_4b4;
      local_3e0 = (long)(int)uVar5;
      if ((long)uVar8 < 1) {
LAB_001cee24:
        auVar29._0_8_ =
             (1.0 - *local_4a0) /
             (local_468[2] * local_438 + *local_468 * local_448 + local_468[1] * dStack_440);
        auVar29._8_8_ = 0;
        if (1 < (int)local_4b4) {
          pdVar6 = local_468 + 5;
          uVar20 = 1;
          do {
            dVar31 = (1.0 - local_4a0[uVar20]) /
                     (*pdVar6 * local_438 + pdVar6[-2] * local_448 + pdVar6[-1] * dStack_440);
            if (dVar31 <= auVar29._0_8_) {
              auVar29._0_8_ = dVar31;
            }
            uVar20 = uVar20 + 1;
            pdVar6 = pdVar6 + 3;
          } while (uVar8 != uVar20);
        }
      }
      else {
        uVar20 = 0xffffffff;
        uVar14 = 0;
        auVar29 = ZEXT816(0x4202a05f20000000);
        do {
          if ((int)local_428 < 1) {
LAB_001ced78:
            dVar33 = (local_468[uVar14 * 3 + 2] * local_438 +
                     local_468[uVar14 * 3] * local_448 + local_468[uVar14 * 3 + 1] * dStack_440) -
                     dVar23;
            auVar34._0_8_ = dVar33 * 1e+20;
            dVar31 = local_4a0[local_3e0] - local_4a0[uVar14];
            auVar34._8_8_ = dVar31;
            auVar36._0_8_ = -auVar34._0_8_;
            auVar36._8_8_ = -dVar31;
            auVar35 = maxpd(auVar34,auVar36);
            if (auVar35._8_8_ < auVar35._0_8_) {
              auVar32._0_8_ = dVar31 / dVar33;
              auVar32._8_8_ = 0;
              if (0.0 < auVar32._0_8_ && auVar32._0_8_ < auVar29._0_8_) {
                uVar20 = uVar14 & 0xffffffff;
                auVar29 = auVar32;
              }
            }
          }
          else {
            uVar13 = 0;
            bVar22 = false;
            do {
              if (uVar14 == __ptr[uVar13]) {
                bVar22 = true;
              }
              uVar13 = uVar13 + 1;
            } while ((local_428 & 0xffffffff) != uVar13);
            if (!bVar22) goto LAB_001ced78;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar8);
        if ((int)uVar20 == -1) goto LAB_001cee24;
      }
      local_4a8 = (REF_CELL)0x0;
      local_480 = 0.0;
      uVar8 = 0;
      iVar21 = 8;
      local_3d8 = dVar23;
      do {
        pRVar28 = auVar29._0_8_;
        pRVar15 = local_490->real;
        pRVar15[local_450] = local_448 * (double)pRVar28 + local_420;
        pRVar15[local_458] = dStack_440 * (double)pRVar28 + local_418;
        pRVar15[local_460] = local_438 * (double)pRVar28 + local_410;
        node_00 = (REF_INT)local_4b0;
        local_3e8 = local_4a8;
        local_4a8 = pRVar28;
        uVar5 = ref_metric_interpolate_node(local_498,node_00);
        if ((uVar5 != 0) && (uVar5 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x89a,"ref_smooth_tet_nso_step");
          uVar8 = (ulong)uVar5;
        }
        if ((uVar5 != 5) && (uVar5 != 0)) goto LAB_001cf2ab;
        uVar4 = ref_smooth_tet_quality_around(local_498,node_00,&local_488);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x89c,"ref_smooth_tet_nso_step",(ulong)uVar4,"rep");
          uVar8 = (ulong)uVar4;
          goto LAB_001cf909;
        }
        if (((iVar21 != 8 && uVar5 == 0) && (local_488 < local_480)) && (local_478 < local_488)) {
          local_488 = local_480;
          pRVar15 = local_490->real;
          pRVar15[local_450] = local_448 * (double)local_3e8 + local_420;
          pRVar15[local_458] = dStack_440 * (double)local_3e8 + local_418;
          pRVar15[local_460] = (double)local_3e8 * local_438 + local_410;
          uVar5 = ref_metric_interpolate_node(local_498,(REF_INT)local_4b0);
          if ((uVar5 != 0) && (uVar5 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x8ab,"ref_smooth_tet_nso_step");
            uVar8 = (ulong)uVar5;
          }
          bVar22 = false;
          if ((uVar5 == 0) || (uVar5 == 5)) goto LAB_001cf274;
          goto LAB_001cf2ab;
        }
        bVar22 = false;
        if (((double)local_4a8 * 0.9 * local_3d8 + local_4a0[local_3e0] < local_488) ||
           ((double)local_4a8 < 1e-12)) goto LAB_001cf274;
        auVar29._0_8_ = (double)local_4a8 * 0.5;
        auVar29._8_8_ = 0;
        local_480 = local_488;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
      pRVar15 = local_490->real;
      pRVar15[local_450] = local_420;
      pRVar15[local_458] = local_418;
      pRVar15[local_460] = local_410;
      if ((uVar5 != 0) && (local_404 != -1)) {
        local_3f0->cell[local_400] = local_404;
      }
      uVar5 = ref_metric_interpolate_node(local_498,(REF_INT)local_4b0);
      if ((uVar5 != 0) && (uVar5 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x8bb,"ref_smooth_tet_nso_step");
        uVar8 = (ulong)uVar5;
      }
      bVar22 = true;
      if ((uVar5 == 5) || (uVar5 == 0)) {
LAB_001cf274:
        if (((int)local_428 == 3) && (local_488 - local_478 < 1e-05)) goto LAB_001cf14b;
        goto LAB_001cf150;
      }
LAB_001cf2ab:
      if ((int)uVar8 != 0) goto LAB_001cf909;
      if (0x62 < local_46c) {
        return 0;
      }
    }
    else {
      uVar4 = ref_cell_nodes(local_4a8,pRVar1->item[lVar11].ref,local_128);
      if (uVar4 != 0) {
LAB_001cf78e:
        uVar8 = (ulong)uVar4;
        pcVar19 = "nodes";
        uVar10 = 0x80d;
        goto LAB_001cf8ff;
      }
      uVar5 = 0xffffffff;
      dVar23 = 1.0;
      while( true ) {
        local_480 = dVar23;
        uVar4 = ref_cell_orient_node0(4,(REF_INT)local_4b0,local_128);
        if (uVar4 != 0) {
          uVar8 = (ulong)uVar4;
          pcVar19 = "orient";
          uVar10 = 0x80e;
          goto LAB_001cf8ff;
        }
        uVar4 = ref_node_tet_dquality_dnode0(local_490,local_128,&local_488,&local_3c8);
        if (uVar4 != 0) {
          uVar8 = (ulong)uVar4;
          pcVar19 = "qual";
          uVar10 = 0x810;
          goto LAB_001cf8ff;
        }
        local_478 = local_488;
        if (uVar5 != 0xffffffff && local_480 <= local_488) {
          local_478 = local_480;
        }
        lVar16 = (long)(int)local_4b4;
        if (uVar5 == 0xffffffff || local_480 > local_488) {
          uVar5 = local_4b4;
        }
        local_4a0[lVar16] = local_488;
        local_468[lVar16 * 3] = local_3c8;
        (local_468 + lVar16 * 3)[1] = dStack_3c0;
        local_468[lVar16 * 3 + 2] = local_3b8;
        uVar4 = local_4b4 + 1;
        pRVar2 = local_4a8->ref_adj->item;
        lVar11 = (long)pRVar2[(int)lVar11].next;
        if (lVar11 == -1) break;
        local_4b4 = uVar4;
        uVar4 = ref_cell_nodes(local_4a8,pRVar2[lVar11].ref,local_128);
        dVar23 = local_478;
        if (uVar4 != 0) goto LAB_001cf78e;
      }
      *__ptr = uVar5;
      bVar22 = (int)local_4b4 < 0;
      local_4b4 = uVar4;
      if (bVar22) goto LAB_001cec74;
      uVar20 = 1;
      uVar8 = 0;
      do {
        if ((uVar5 != uVar8) && (local_4a0[uVar8] - local_4a0[(int)*__ptr] < 1e-12)) {
          __ptr[(int)uVar20] = (uint)uVar8;
          uVar20 = (ulong)((int)uVar20 + 1);
        }
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
      iVar21 = (int)uVar20;
      if (iVar21 < 4) {
        if (iVar21 == 1) goto LAB_001cec74;
        if (0 < iVar21) {
          pdVar6 = local_1a8 + uVar20;
          uVar8 = 0;
          do {
            local_1a8[uVar8] = 1.0;
            uVar3 = __ptr[uVar8];
            lVar11 = 0;
            pdVar7 = pdVar6;
            do {
              lVar16 = (long)(int)uVar3 * 3 + lVar11;
              lVar11 = lVar11 + 1;
              *pdVar7 = (double)((ulong)local_468[lVar16] ^ (ulong)DAT_001fe090);
              pdVar7 = pdVar7 + uVar20;
            } while (lVar11 != 3);
            uVar8 = uVar8 + 1;
            pdVar6 = pdVar6 + 1;
          } while (uVar8 != uVar20);
          uVar14 = (ulong)(iVar21 + 1U & 0xfffffffe);
          lVar11 = uVar20 - 1;
          auVar24._8_4_ = (int)lVar11;
          auVar24._0_8_ = lVar11;
          auVar24._12_4_ = (int)((ulong)lVar11 >> 0x20);
          pRVar15 = local_228;
          uVar13 = 0;
          uVar8 = uVar14;
          auVar35 = _DAT_001fe2e0;
          pRVar12 = pRVar15;
          do {
            do {
              bVar22 = SUB164(auVar24 ^ _DAT_001fe2f0,0) < SUB164(auVar35 ^ _DAT_001fe2f0,0);
              iVar25 = SUB164(auVar24 ^ _DAT_001fe2f0,4);
              iVar30 = SUB164(auVar35 ^ _DAT_001fe2f0,4);
              if ((bool)(~(iVar25 < iVar30 || iVar30 == iVar25 && bVar22) & 1)) {
                *pRVar15 = 0.0;
              }
              if (iVar25 >= iVar30 && (iVar30 != iVar25 || !bVar22)) {
                pRVar15[uVar20] = 0.0;
              }
              auVar26._0_8_ = auVar35._0_8_ + 2;
              auVar26._8_8_ = auVar35._8_8_ + 2;
              pRVar15 = pRVar15 + uVar20 * 2;
              uVar8 = uVar8 - 2;
              auVar35 = auVar26;
            } while (uVar8 != 0);
            uVar13 = uVar13 + 1;
            pRVar15 = pRVar12 + 1;
            uVar8 = uVar14;
            auVar35 = _DAT_001fe2e0;
            pRVar12 = pRVar15;
          } while (uVar13 != uVar20);
          lVar11 = 0;
          uVar8 = 0;
          do {
            lVar16 = 0;
            uVar14 = 0;
            do {
              lVar17 = uVar14 * uVar20 + uVar8;
              dVar23 = local_1a8[lVar17 + -0x10];
              lVar18 = 4;
              pdVar6 = local_1a8;
              do {
                dVar23 = dVar23 + *(double *)((long)pdVar6 + lVar11) *
                                  *(double *)((long)pdVar6 + lVar16);
                pdVar6 = pdVar6 + uVar20;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
              local_1a8[lVar17 + -0x10] = dVar23;
              uVar14 = uVar14 + 1;
              lVar16 = lVar16 + 8;
            } while (uVar14 != uVar20);
            uVar8 = uVar8 + 1;
            lVar11 = lVar11 + 8;
          } while (uVar8 != uVar20);
        }
        uVar4 = ref_matrix_inv_gen(iVar21,local_228,local_b8);
        if (uVar4 != 0) {
          uVar8 = (ulong)uVar4;
          pcVar19 = "inv";
          uVar10 = 0x848;
          goto LAB_001cf8ff;
        }
        lVar11 = uVar20 - 1;
        auVar35._8_4_ = (int)lVar11;
        auVar35._0_8_ = lVar11;
        auVar35._12_4_ = (int)((ulong)lVar11 >> 0x20);
        puVar9 = local_288;
        lVar11 = 0;
        do {
          if (0 < iVar21) {
            lVar16 = 0;
            auVar27 = _DAT_001fe2e0;
            do {
              bVar22 = SUB164(auVar35 ^ _DAT_001fe2f0,0) < SUB164(auVar27 ^ _DAT_001fe2f0,0);
              iVar25 = SUB164(auVar35 ^ _DAT_001fe2f0,4);
              iVar30 = SUB164(auVar27 ^ _DAT_001fe2f0,4);
              if ((bool)(~(iVar25 < iVar30 || iVar30 == iVar25 && bVar22) & 1)) {
                *(undefined8 *)(puVar9 + lVar16 + -0x20) = 0;
              }
              if (iVar25 >= iVar30 && (iVar30 != iVar25 || !bVar22)) {
                *(undefined8 *)(puVar9 + lVar16) = 0;
              }
              lVar17 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 2;
              auVar27._8_8_ = lVar17 + 2;
              lVar16 = lVar16 + 0x40;
            } while ((ulong)(iVar21 + 1U >> 1) << 6 != lVar16);
          }
          lVar11 = lVar11 + 1;
          puVar9 = puVar9 + 8;
        } while (lVar11 != 4);
        uVar8 = 0;
        lVar11 = 0;
        do {
          if (0 < iVar21) {
            pRVar15 = local_b8;
            uVar14 = 0;
            do {
              lVar16 = lVar11 + uVar14 * 4;
              dVar23 = local_2a8[lVar16];
              uVar13 = 0;
              do {
                dVar23 = dVar23 + local_1a8[uVar8 + uVar13] * pRVar15[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar20 != uVar13);
              local_2a8[lVar16] = dVar23;
              uVar14 = uVar14 + 1;
              pRVar15 = pRVar15 + uVar20;
            } while (uVar14 != uVar20);
          }
          lVar11 = lVar11 + 1;
          uVar8 = (ulong)(uint)((int)uVar8 + iVar21);
        } while (lVar11 != 4);
        pdVar6 = local_328;
        lVar11 = 0;
        do {
          lVar16 = 0;
          do {
            *(undefined8 *)((long)pdVar6 + lVar16) = 0;
            lVar16 = lVar16 + 0x20;
          } while (lVar16 != 0x80);
          lVar11 = lVar11 + 1;
          pdVar6 = pdVar6 + 1;
        } while (lVar11 != 4);
        pdVar6 = local_2a8;
        lVar11 = 0;
        do {
          lVar16 = 0;
          pdVar7 = local_1a8;
          do {
            if (0 < iVar21) {
              lVar17 = lVar11 + lVar16 * 4;
              dVar23 = local_328[lVar17];
              lVar18 = 0;
              do {
                dVar23 = dVar23 + *(double *)((long)pdVar6 + lVar18 * 4) *
                                  *(double *)((long)pdVar7 + lVar18);
                lVar18 = lVar18 + 8;
              } while (uVar20 * 8 - lVar18 != 0);
              local_328[lVar17] = dVar23;
            }
            lVar16 = lVar16 + 1;
            pdVar7 = pdVar7 + uVar20;
          } while (lVar16 != 4);
          lVar11 = lVar11 + 1;
          pdVar6 = pdVar6 + 1;
        } while (lVar11 != 4);
        pdVar6 = local_328;
        pdVar7 = local_3a8;
        lVar11 = 0;
        do {
          lVar16 = 0;
          do {
            *(ulong *)((long)pdVar7 + lVar16) =
                 *(ulong *)((long)pdVar6 + lVar16) ^ (ulong)DAT_001fe090;
            lVar16 = lVar16 + 0x20;
          } while (lVar16 != 0x80);
          lVar11 = lVar11 + 1;
          pdVar7 = pdVar7 + 1;
          pdVar6 = pdVar6 + 1;
        } while (lVar11 != 4);
        lVar11 = 0;
        do {
          *(double *)((long)local_3a8 + lVar11) = *(double *)((long)local_3a8 + lVar11) + 1.0;
          lVar11 = lVar11 + 0x28;
        } while (lVar11 != 0xa0);
        local_438 = local_3a8[3];
        local_448 = local_3a8[1];
        dStack_440 = local_3a8[2];
        local_428 = uVar20;
        goto LAB_001ceca0;
      }
LAB_001cf14b:
      bVar22 = true;
LAB_001cf150:
      pdVar6 = local_4a0;
      free(local_468);
      free(pdVar6);
      free(__ptr);
      if (bVar22) {
        return 0;
      }
      if (0x62 < local_46c) {
        return 0;
      }
    }
    uVar5 = local_46c + 1;
    local_490 = local_498->node;
    local_4a8 = local_498->cell[8];
  }
  pcVar19 = "malloc active of REF_INT NULL";
  uVar10 = 0x805;
LAB_001cf8cc:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar10,
         "ref_smooth_tet_nso_step",pcVar19);
  uVar8 = 2;
LAB_001cf909:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x8dd,
         "ref_smooth_tet_nso",uVar8,"step");
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid, REF_INT node) {
  REF_BOOL allowed, interior;
  REF_BOOL complete = REF_FALSE;
  REF_INT step;

  RSS(ref_smooth_local_cell_about(ref_grid_tet(ref_grid),
                                  ref_grid_node(ref_grid), node, &allowed),
      "para");
  if (!allowed) return REF_SUCCESS;

  interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
             ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  if (!interior) return REF_SUCCESS;

  for (step = 0; step < 100; step++) {
    RSS(ref_smooth_tet_nso_step(ref_grid, node, &complete), "step");
    if (complete) break;
  }

  return REF_SUCCESS;
}